

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  pointer pBVar1;
  iterator __position;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  int iVar4;
  Layer *pLVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  ParamDict pd;
  int local_cb4;
  int local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  ulong local_ca0;
  vector<int,_std::allocator<int>_> *local_c98;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_c90;
  int local_c84;
  Layer *local_c80;
  long *local_c78 [2];
  long local_c68 [2];
  Net *local_c58;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c50;
  DataReader *local_c48;
  ulong local_c40;
  long *local_c38 [2];
  long local_c28 [30];
  char local_b38 [256];
  char local_a38 [264];
  ParamDict local_930;
  
  local_c84 = 0;
  iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar4 == 1) {
    if (local_c84 == 0x7685dd) {
      local_ca4 = 0;
      local_ca8 = 0;
      iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar4 == 1) {
        iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_ca8);
        if (iVar4 == 1) {
          if ((0 < (long)local_ca4) && (0 < local_ca8)) {
            local_c50 = &this->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_c50,(long)local_ca4);
            local_c90 = &this->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(local_c90,(long)local_ca8);
            ParamDict::ParamDict(&local_930);
            local_cb4 = 0;
            if (0 < local_ca4) {
              local_ca0 = 0;
              local_c58 = this;
              local_c48 = dr;
              do {
                local_cac = 0;
                local_cb0 = 0;
                iVar4 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_b38);
                if (iVar4 != 1) {
                  load_param();
LAB_001145b4:
                  iVar4 = -1;
                  goto LAB_001145b9;
                }
                iVar4 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_a38);
                if (iVar4 != 1) {
                  load_param();
                  goto LAB_001145b4;
                }
                iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_cac);
                if (iVar4 != 1) {
                  load_param();
                  goto LAB_001145b4;
                }
                iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_cb0);
                if (iVar4 != 1) {
                  load_param();
                  goto LAB_001145b4;
                }
                pLVar5 = create_layer(local_b38);
                if ((pLVar5 == (Layer *)0x0) &&
                   (pLVar5 = create_custom_layer(this,local_b38), pLVar5 == (Layer *)0x0)) {
                  fprintf(_stderr,"layer %s not exists or registered\n",local_b38);
                  clear(this);
                  goto LAB_001145b4;
                }
                local_c38[0] = local_c28;
                sVar6 = strlen(local_b38);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_c38,local_b38,local_b38 + sVar6);
                std::__cxx11::string::operator=((string *)&pLVar5->type,(string *)local_c38);
                if (local_c38[0] != local_c28) {
                  operator_delete(local_c38[0],local_c28[0] + 1);
                }
                local_c38[0] = local_c28;
                sVar6 = strlen(local_a38);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_c38,local_a38,local_a38 + sVar6);
                std::__cxx11::string::operator=((string *)&pLVar5->name,(string *)local_c38);
                if (local_c38[0] != local_c28) {
                  operator_delete(local_c38[0],local_c28[0] + 1);
                }
                local_c98 = &pLVar5->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_c98,(long)local_cac);
                local_c80 = pLVar5;
                if (0 < local_cac) {
                  lVar7 = 0;
                  do {
                    iVar4 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                    if (iVar4 != 1) {
                      load_param();
                      goto LAB_001145b4;
                    }
                    iVar4 = find_blob_index_by_name(this,(char *)local_c38);
                    if (iVar4 == -1) {
                      pBVar1 = (local_c90->
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      local_c78[0] = local_c68;
                      sVar6 = strlen((char *)local_c38);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c78,local_c38,(long)local_c38 + sVar6);
                      lVar8 = (long)(int)local_ca0;
                      std::__cxx11::string::operator=
                                ((string *)(pBVar1 + lVar8),(string *)local_c78);
                      if (local_c78[0] != local_c68) {
                        operator_delete(local_c78[0],local_c68[0] + 1);
                      }
                      iVar4 = (int)local_ca0;
                      local_ca0 = (ulong)(iVar4 + 1);
                      dr = local_c48;
                    }
                    else {
                      lVar8 = (long)iVar4;
                    }
                    pBVar1 = (local_c90->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    __position._M_current =
                         pBVar1[lVar8].consumers.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        pBVar1[lVar8].consumers.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&pBVar1[lVar8].consumers,
                                 __position,&local_cb4);
                    }
                    else {
                      *__position._M_current = local_cb4;
                      pBVar1[lVar8].consumers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                    (local_c98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar7] = iVar4;
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < local_cac);
                }
                pLVar5 = local_c80;
                local_c98 = &local_c80->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_c98,(long)local_cb0);
                if (0 < local_cb0) {
                  local_c40 = local_ca0 & 0xffffffff;
                  lVar7 = (long)(int)local_ca0 << 6;
                  lVar8 = 0;
                  do {
                    pBVar1 = (local_c90->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    iVar4 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                    if (iVar4 != 1) {
                      load_param();
                      goto LAB_001145b4;
                    }
                    local_c78[0] = local_c68;
                    sVar6 = strlen((char *)local_c38);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c78,local_c38,(long)local_c38 + sVar6);
                    std::__cxx11::string::operator=
                              ((string *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar7),
                               (string *)local_c78);
                    if (local_c78[0] != local_c68) {
                      operator_delete(local_c78[0],local_c68[0] + 1);
                    }
                    *(int *)((long)&pBVar1->producer + lVar7) = local_cb4;
                    (local_c98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar8] = (int)local_c40 + (int)lVar8;
                    lVar8 = lVar8 + 1;
                    lVar7 = lVar7 + 0x40;
                  } while (lVar8 < local_cb0);
                  local_ca0 = (ulong)(uint)((int)local_ca0 + (int)lVar8);
                  this = local_c58;
                  pLVar5 = local_c80;
                }
                iVar4 = ParamDict::load_param(&local_930,dr);
                if (iVar4 == 0) {
                  iVar4 = (*pLVar5->_vptr_Layer[2])(pLVar5,&local_930);
                  if (iVar4 == 0) {
                    (local_c50->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[local_cb4] = pLVar5;
                  }
                  else {
                    load_param();
                  }
                }
                else {
                  load_param();
                }
                local_cb4 = local_cb4 + 1;
              } while (local_cb4 < local_ca4);
            }
            iVar4 = 0;
LAB_001145b9:
            lVar7 = 0x8c0;
            do {
              piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar7);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  __ptr = *(void **)((long)&local_930.params[0].type + lVar7);
                  plVar3 = *(long **)((long)&local_930.params[0].v.elempack + lVar7);
                  if (plVar3 == (long *)0x0) {
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                  }
                  else {
                    (**(code **)(*plVar3 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar7 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar7 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar7) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar7) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar7) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar7) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar7) = 0;
              lVar7 = lVar7 + -0x48;
            } while (lVar7 != -0x40);
            return iVar4;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        fprintf(stderr, "parse " #v " failed\n"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %s not exists or registered\n", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d %s\n", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 fprintf(stderr, "new blob %s\n", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}